

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O1

void __thiscall
Js::FunctionExecutionStateMachine::SetSimpleJitCallCount
          (FunctionExecutionStateMachine *this,uint16 simpleJitLimit)

{
  code *pcVar1;
  ExecutionMode executionMode;
  bool bVar2;
  undefined4 *puVar3;
  FunctionEntryPointInfo *pFVar4;
  FunctionEntryPointInfo *pFVar5;
  uint uVar6;
  Type TVar7;
  
  uVar6 = (uint)simpleJitLimit;
  executionMode = StateToMode(this,this->executionState);
  VerifyExecutionMode(this,executionMode);
  if (executionMode != SimpleJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x149,"(GetExecutionMode() == ExecutionMode::SimpleJit)",
                                "GetExecutionMode() == ExecutionMode::SimpleJit");
    if (!bVar2) goto LAB_0078b640;
    *puVar3 = 0;
  }
  pFVar4 = FunctionBody::GetDefaultFunctionEntryPointInfo((this->owner).ptr);
  pFVar5 = FunctionBody::GetSimpleJitEntryPointInfo((this->owner).ptr);
  if (pFVar4 != pFVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x14a,
                                "(owner->GetDefaultFunctionEntryPointInfo() == owner->GetSimpleJitEntryPointInfo())"
                                ,
                                "owner->GetDefaultFunctionEntryPointInfo() == owner->GetSimpleJitEntryPointInfo()"
                               );
    if (!bVar2) {
LAB_0078b640:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (0xfe < simpleJitLimit) {
    uVar6 = 0xff;
  }
  TVar7 = 0;
  if (simpleJitLimit != 0) {
    TVar7 = uVar6 - 1;
  }
  pFVar4 = FunctionBody::GetSimpleJitEntryPointInfo((this->owner).ptr);
  pFVar4->callsCount = TVar7;
  return;
}

Assistant:

void FunctionExecutionStateMachine::SetSimpleJitCallCount(const uint16 simpleJitLimit) const
    {
        Assert(GetExecutionMode() == ExecutionMode::SimpleJit);
        Assert(owner->GetDefaultFunctionEntryPointInfo() == owner->GetSimpleJitEntryPointInfo());

        // Simple JIT counts down and transitions on overflow
        const uint8 limit = static_cast<uint8>(min(0xffui16, simpleJitLimit));
        owner->GetSimpleJitEntryPointInfo()->callsCount = limit == 0 ? 0 : limit - 1;
    }